

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O1

SerializedMessage * __thiscall
miniros::serialization::serializeServiceResponse<std_msgs::String_<std::allocator<void>>>
          (SerializedMessage *__return_storage_ptr__,serialization *this,bool ok,
          String_<std::allocator<void>_> *message)

{
  uint uVar1;
  element_type *peVar2;
  size_t sVar3;
  uchar *puVar4;
  undefined7 in_register_00000011;
  undefined8 *puVar5;
  ulong uVar6;
  uint8_t *old_data;
  element_type *__dest;
  
  puVar5 = (undefined8 *)CONCAT71(in_register_00000011,ok);
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->num_bytes = 0;
  __return_storage_ptr__->message_start = (uint8_t *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->type_info = (type_info *)0x0;
  if ((int)this == 0) {
    uVar6 = (ulong)((int)puVar5[1] + 5);
    __return_storage_ptr__->num_bytes = uVar6;
    puVar4 = (uchar *)operator_new__(uVar6);
    std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
              ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
               puVar4);
    peVar2 = (__return_storage_ptr__->buf).
             super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar1 = (uint)__return_storage_ptr__->num_bytes;
    if ((ulong)uVar1 == 0) {
      throwStreamOverrun();
    }
    *peVar2 = (element_type)this;
    uVar6 = puVar5[1];
    if (uVar1 < 5) {
      throwStreamOverrun();
    }
    *(int *)(peVar2 + 1) = (int)uVar6;
    if (uVar6 == 0) {
      return __return_storage_ptr__;
    }
    __dest = peVar2 + 5;
    if (peVar2 + uVar1 < __dest + (uVar6 & 0xffffffff)) {
      throwStreamOverrun();
    }
  }
  else {
    uVar6 = (ulong)((int)puVar5[1] + 9);
    __return_storage_ptr__->num_bytes = uVar6;
    puVar4 = (uchar *)operator_new__(uVar6);
    std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
              ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
               puVar4);
    peVar2 = (__return_storage_ptr__->buf).
             super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar1 = (uint)__return_storage_ptr__->num_bytes;
    if ((ulong)uVar1 == 0) {
      throwStreamOverrun();
    }
    *peVar2 = (element_type)this;
    sVar3 = __return_storage_ptr__->num_bytes;
    if (uVar1 < 5) {
      throwStreamOverrun();
    }
    *(int *)(peVar2 + 1) = (int)sVar3 + -5;
    uVar6 = puVar5[1];
    if (uVar1 < 9) {
      throwStreamOverrun();
    }
    *(int *)(peVar2 + 5) = (int)uVar6;
    if (uVar6 == 0) {
      return __return_storage_ptr__;
    }
    __dest = peVar2 + 9;
    if (peVar2 + uVar1 < __dest + (uVar6 & 0xffffffff)) {
      throwStreamOverrun();
    }
  }
  memcpy(__dest,(void *)*puVar5,uVar6);
  return __return_storage_ptr__;
}

Assistant:

inline SerializedMessage serializeServiceResponse(bool ok, const M& message)
{
  SerializedMessage m;

  if (ok)
  {
    uint32_t len = serializationLength(message);
    m.num_bytes = len + 5;
    m.buf.reset(new uint8_t[m.num_bytes]);

    OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
    serialize(s, static_cast<uint8_t>(ok));
    serialize(s, static_cast<uint32_t>(m.num_bytes) - 5);
    serialize(s, message);
  }
  else
  {
    uint32_t len = serializationLength(message);
    m.num_bytes = len + 1;
    m.buf.reset(new uint8_t[m.num_bytes]);

    OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
    serialize(s, static_cast<uint8_t>(ok));
    serialize(s, message);
  }

  return m;
}